

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O0

SubpassAttachmentHandle __thiscall
myvk::RenderPassState::RegisterSubpass
          (RenderPassState *this,uint32_t subpass,char *subpass_str,VkSubpassDescriptionFlags flags)

{
  reference pvVar1;
  VkSubpassDescriptionFlags in_ECX;
  uint in_ESI;
  value_type *in_RDI;
  SubpassAttachmentHandle SVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  uint *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_58;
  uint local_1c;
  undefined1 local_10 [12];
  
  this_00 = &local_58;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = in_ECX;
  local_1c = in_ESI;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*&,_unsigned_int_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::insert(this_00,in_RDI);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)0x2cfa24);
  pvVar1 = std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::operator[]
                     ((vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> *)
                      ((long)&in_RDI[3].first.field_2 + 8),(ulong)local_1c);
  pvVar1->flags = local_58._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  SubpassAttachmentHandle::SubpassAttachmentHandle
            ((SubpassAttachmentHandle *)local_10,(RenderPassState *)in_RDI,local_1c);
  SVar2._12_4_ = 0;
  SVar2.m_state_ptr = (RenderPassState *)local_10._0_8_;
  SVar2.m_subpass = local_10._8_4_;
  return SVar2;
}

Assistant:

RenderPassState::SubpassAttachmentHandle RenderPassState::RegisterSubpass(uint32_t subpass, const char *subpass_str,
                                                                          VkSubpassDescriptionFlags flags) {
	assert(subpass < get_subpass_count());
	assert(m_subpass_map.find(subpass_str) == m_subpass_map.end());
	assert(m_subpass_descriptions[subpass].flags == VK_SUBPASS_DESCRIPTION_FLAG_BITS_MAX_ENUM);

	m_subpass_map.insert({subpass_str, subpass});
	m_subpass_descriptions[subpass].flags = flags;
	return {this, subpass};
}